

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Key.cpp
# Opt level: O3

void MiniScript::KeyPutString(String *s,bool inFront)

{
  long *plVar1;
  bool bVar2;
  ulong *puVar3;
  String *pos;
  uint uVar4;
  unsigned_long uVar5;
  ulong *puVar6;
  long lVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  undefined7 in_register_00000031;
  uchar *puVar12;
  ulong uVar13;
  StringStorage *this;
  ulong uVar14;
  ulong uVar15;
  String character;
  String local_58;
  unsigned_long local_48;
  String *local_40;
  unsigned_long local_38;
  
  this = s->ss;
  local_40 = s;
  if ((int)CONCAT71(in_register_00000031,inFront) == 0) {
    if (this != (StringStorage *)0x0) {
      uVar14 = 0;
      do {
        pos = local_40;
        lVar7 = this->charCount;
        if (lVar7 < 0) {
          StringStorage::analyzeChars(this);
          lVar7 = pos->ss->charCount;
        }
        if (lVar7 <= (long)uVar14) {
          return;
        }
        String::Substring(&local_58,(long)pos,uVar14);
        puVar12 = "";
        if (local_58.ss != (StringStorage *)0x0) {
          puVar12 = (uchar *)(local_58.ss)->data;
        }
        local_38 = UTF8Decode(puVar12);
        uVar11 = DAT_001c0d10;
        uVar15 = inputBuffer;
        local_48 = uVar14;
        if (DAT_001c0d18 <= DAT_001c0d10) {
          do {
            puVar3 = DAT_001c0d08;
            uVar14 = uVar15;
            if (uVar15 == 0) {
              uVar14 = DAT_001c0d18;
            }
            if (uVar14 < 0x11) {
              uVar14 = 0x10;
            }
            uVar14 = uVar14 + DAT_001c0d18;
            uVar10 = uVar14 * 8;
            if (0x1fffffffffffffff < uVar14) {
              uVar10 = 0xffffffffffffffff;
            }
            puVar6 = (ulong *)operator_new__(uVar10);
            if (puVar3 != (ulong *)0x0) {
              if ((long)uVar14 <= (long)uVar11) {
                uVar11 = uVar14;
              }
              if (0 < (long)uVar11) {
                puVar8 = puVar3;
                puVar9 = puVar6;
                do {
                  uVar15 = *puVar8;
                  puVar8 = puVar8 + 1;
                  *puVar9 = uVar15;
                  puVar9 = puVar9 + 1;
                } while (puVar8 < puVar3 + uVar11);
              }
              operator_delete__(puVar3);
              uVar11 = DAT_001c0d10;
              uVar15 = inputBuffer;
            }
            if (uVar14 < uVar11) {
              uVar11 = uVar14;
              DAT_001c0d10 = uVar14;
            }
            DAT_001c0d08 = puVar6;
            DAT_001c0d18 = uVar14;
          } while (uVar14 <= uVar11);
        }
        DAT_001c0d08[uVar11] = local_38 & 0xffffffff;
        DAT_001c0d10 = DAT_001c0d10 + 1;
        if ((local_58.ss != (StringStorage *)0x0) && (local_58.isTemp == false)) {
          plVar1 = &((local_58.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_58.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
        }
        uVar14 = local_48 + 1;
        this = local_40->ss;
      } while (this != (StringStorage *)0x0);
    }
  }
  else if (this != (StringStorage *)0x0) {
    lVar7 = this->charCount;
    if (lVar7 < 0) {
      StringStorage::analyzeChars(this);
      lVar7 = s->ss->charCount;
    }
    uVar4 = (int)lVar7 - 1;
    if (-1 < (int)uVar4) {
      uVar14 = (ulong)uVar4;
      do {
        String::Substring(&local_58,(long)s,uVar14);
        puVar12 = "";
        if (local_58.ss != (StringStorage *)0x0) {
          puVar12 = (uchar *)(local_58.ss)->data;
        }
        uVar5 = UTF8Decode(puVar12);
        if ((long)DAT_001c0d10 < 0) {
          _Error("invalid index in SimpleVector::insert",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                 ,0x124);
        }
        else {
          uVar11 = inputBuffer;
          uVar15 = DAT_001c0d10;
          local_48 = uVar5;
          if (DAT_001c0d18 <= DAT_001c0d10) {
            do {
              puVar3 = DAT_001c0d08;
              uVar10 = uVar11;
              if (uVar11 == 0) {
                uVar10 = DAT_001c0d18;
              }
              if (uVar10 < 0x11) {
                uVar10 = 0x10;
              }
              uVar10 = uVar10 + DAT_001c0d18;
              uVar13 = uVar10 * 8;
              if (0x1fffffffffffffff < uVar10) {
                uVar13 = 0xffffffffffffffff;
              }
              puVar6 = (ulong *)operator_new__(uVar13);
              if (puVar3 != (ulong *)0x0) {
                if ((long)uVar10 <= (long)uVar15) {
                  uVar15 = uVar10;
                }
                if (0 < (long)uVar15) {
                  puVar8 = puVar3;
                  puVar9 = puVar6;
                  do {
                    uVar11 = *puVar8;
                    puVar8 = puVar8 + 1;
                    *puVar9 = uVar11;
                    puVar9 = puVar9 + 1;
                  } while (puVar8 < puVar3 + uVar15);
                }
                operator_delete__(puVar3);
                uVar11 = inputBuffer;
                uVar15 = DAT_001c0d10;
              }
              if (uVar10 < uVar15) {
                uVar15 = uVar10;
                DAT_001c0d10 = uVar10;
              }
              DAT_001c0d08 = puVar6;
              DAT_001c0d18 = uVar10;
            } while (uVar10 <= uVar15);
          }
          puVar3 = DAT_001c0d08;
          if (0 < (long)uVar15) {
            for (puVar6 = DAT_001c0d08 + (uVar15 - 1); puVar3 <= puVar6; puVar6 = puVar6 + -1) {
              puVar6[1] = *puVar6;
            }
          }
          *DAT_001c0d08 = local_48 & 0xffffffff;
          DAT_001c0d10 = DAT_001c0d10 + 1;
          s = local_40;
        }
        if ((local_58.ss != (StringStorage *)0x0) && (local_58.isTemp == false)) {
          plVar1 = &((local_58.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_58.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
        }
        bVar2 = 0 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void KeyPutString(String s, bool inFront) {
	if (inFront) {
		for (int i=s.Length()-1; i>=0; i--) {
			struct InputBufferEntry e = {0, 0};
			String character = s.Substring(i, 1);
			e.c = UTF8Decode((unsigned char *)character.c_str());
			inputBuffer.insert(e, 0);
		}
	} else {
		for (int i=0; i<s.Length(); i++) {
			struct InputBufferEntry e = {0, 0};
			String character = s.Substring(i, 1);
			e.c = UTF8Decode((unsigned char *)character.c_str());
			inputBuffer.push_back(e);
		}
	}
}